

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_rep(jit_State *J,RecordFFData *rd)

{
  short sVar1;
  IRRef1 IVar2;
  TRef TVar3;
  int32_t iVar4;
  TRef TVar5;
  TRef tr2;
  TRef hdr2;
  int32_t vrep;
  TRef sep;
  TRef str2;
  TRef tr;
  TRef hdr;
  TRef rep;
  TRef str;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  hdr = lj_ir_tostr(J,*J->base);
  tr = lj_opt_narrow_toint(J,J->base[1]);
  vrep = 0;
  if ((J->base[2] & 0x1f000000) != 0) {
    TVar3 = lj_ir_tostr(J,J->base[2]);
    iVar4 = argv2int(J,rd->argv + 1);
    sVar1 = 2;
    if (1 < iVar4) {
      sVar1 = 3;
    }
    TVar5 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = sVar1 << 8 | 0x93;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
    lj_opt_fold(J);
    if (1 < iVar4) {
      TVar5 = recff_bufhdr(J);
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)hdr;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5784;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      vrep = lj_opt_fold(J);
    }
  }
  sep = recff_bufhdr(J);
  IVar2 = (IRRef1)sep;
  if (vrep != 0) {
    (J->fold).ins.field_0.ot = 0x5689;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)hdr;
    sep = lj_opt_fold(J);
    hdr = vrep;
    TVar3 = lj_ir_kint(J,-1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    tr = lj_opt_fold(J);
  }
  TVar3 = lj_ir_call(J,IRCALL_lj_buf_putstr_rep,(ulong)sep,(ulong)hdr,(ulong)tr);
  (J->fold).ins.field_0.ot = 0x5784;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op2 = IVar2;
  TVar3 = lj_opt_fold(J);
  *J->base = TVar3;
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_rep(jit_State *J, RecordFFData *rd)
{
  TRef str = lj_ir_tostr(J, J->base[0]);
  TRef rep = lj_opt_narrow_toint(J, J->base[1]);
  TRef hdr, tr, str2 = 0;
  if (!tref_isnil(J->base[2])) {
    TRef sep = lj_ir_tostr(J, J->base[2]);
    int32_t vrep = argv2int(J, &rd->argv[1]);
    emitir(IRTGI(vrep > 1 ? IR_GT : IR_LE), rep, lj_ir_kint(J, 1));
    if (vrep > 1) {
      TRef hdr2 = recff_bufhdr(J);
      TRef tr2 = emitir(IRTG(IR_BUFPUT, IRT_PGC), hdr2, sep);
      tr2 = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr2, str);
      str2 = emitir(IRTG(IR_BUFSTR, IRT_STR), tr2, hdr2);
    }
  }
  tr = hdr = recff_bufhdr(J);
  if (str2) {
    tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, str);
    str = str2;
    rep = emitir(IRTI(IR_ADD), rep, lj_ir_kint(J, -1));
  }
  tr = lj_ir_call(J, IRCALL_lj_buf_putstr_rep, tr, str, rep);
  J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
}